

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildTranslation(CNscPStackEntry *pList,CNscPStackEntry *pTranslation)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  CNwnDoubleLinkList *pCVar4;
  CNwnDoubleLinkList *pNext;
  
  pCVar3 = g_pCtx;
  if (pTranslation != (CNscPStackEntry *)0x0) {
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pTranslation->m_link).m_pNext;
    if (pCVar2 != pTranslation) {
      pCVar4 = (pTranslation->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar4;
      pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pTranslation->m_link).m_pNext = &pTranslation->m_link;
    }
    pCVar4 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pTranslation) {
      pCVar4 = pCVar1;
    }
    pCVar1 = pCVar4->m_pNext;
    (pTranslation->m_link).m_pNext = pCVar1;
    (pTranslation->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = &pTranslation->m_link;
    pCVar1->m_pPrev = &pTranslation->m_link;
  }
  return (CNscPStackEntry *)0x0;
}

Assistant:

YYSTYPE NscBuildTranslation (YYSTYPE pList, YYSTYPE pTranslation)
{
	pList;

	//
	// Free any entry (probably only declarations)
	//

	if (pTranslation)
        g_pCtx ->FreePStackEntry (pTranslation);

	//
	// Return the new expression
	//

	return NULL;
}